

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id3.c
# Opt level: O2

uint id3_fill_tframe(uchar *buf,uint len,char *type,uchar encoding,char *string)

{
  uint uVar1;
  size_t sVar2;
  unsigned_long uVar3;
  uint uVar4;
  char *__assertion;
  
  if (buf == (uchar *)0x0) {
    __assertion = "buf != NULL";
    uVar1 = 0x47;
  }
  else if (len == 0) {
    __assertion = "len > 0";
    uVar1 = 0x48;
  }
  else if (type == (char *)0x0) {
    __assertion = "type != NULL";
    uVar1 = 0x49;
  }
  else {
    if (string != (char *)0x0) {
      sVar2 = strlen(string);
      uVar4 = (int)sVar2 + 8;
      uVar1 = 0;
      if (uVar4 <= len) {
        buf[2] = type[2];
        *(undefined2 *)buf = *(undefined2 *)type;
        uVar3 = id3_sync_safe((ulong)((int)sVar2 + 2));
        buf[3] = (uchar)(uVar3 >> 0x10);
        buf[4] = (uchar)(uVar3 >> 8);
        buf[5] = (uchar)uVar3;
        buf[6] = encoding;
        memcpy(buf + 7,string,sVar2 & 0xffffffff);
        buf[(sVar2 & 0xffffffff) + 7] = '\0';
        uVar1 = uVar4;
      }
      return uVar1;
    }
    __assertion = "string != NULL";
    uVar1 = 0x4a;
  }
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",
                uVar1,
                "unsigned int id3_fill_tframe(unsigned char *, unsigned int, char *, unsigned char, char *)"
               );
}

Assistant:

unsigned int id3_fill_tframe(unsigned char *buf, unsigned int len,
                             char *type,
                             unsigned char encoding,
                             char *string) {
  assert(buf != NULL);
  assert(len > 0);
  assert(type != NULL);
  assert(string != NULL);

  unsigned char *ptr = buf;
  unsigned int slen = strlen(string);
  unsigned int flen = slen + 2;
  if (len < 6 + flen)
    return 0;
  memcpy(ptr, type, 3); ptr += 3;
  UINT24_PACK(ptr, id3_sync_safe(flen));
  UINT8_PACK(ptr, encoding);
  memcpy(ptr, string, slen); ptr += slen;
  UINT8_PACK(ptr, 0x00);

  return flen + 6;
}